

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O0

Quaternion *
AML::eulerAngles2Quat_XZY(Quaternion *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double q3;
  double q2;
  double q1;
  double q0;
  double s3;
  double c3;
  double s2;
  double c2;
  double s1;
  double c1;
  double psi_local;
  double theta_local;
  double phi_local;
  
  dVar1 = cos(phi * 0.5);
  dVar2 = sin(phi * 0.5);
  dVar3 = cos(theta * 0.5);
  dVar4 = sin(theta * 0.5);
  dVar5 = cos(psi * 0.5);
  dVar6 = sin(psi * 0.5);
  Quaternion::Quaternion
            (__return_storage_ptr__,dVar1 * dVar3 * dVar5 + -(dVar2 * dVar4 * dVar6),
             dVar1 * dVar4 * dVar6 + dVar2 * dVar3 * dVar5,
             dVar1 * dVar3 * dVar6 + dVar2 * dVar4 * dVar5,
             dVar1 * dVar4 * dVar5 + -(dVar2 * dVar3 * dVar6));
  return __return_storage_ptr__;
}

Assistant:

Quaternion eulerAngles2Quat_XZY(double phi, double theta, double psi)
    {
        const double c1 = cos(0.5 * phi);
        const double s1 = sin(0.5 * phi);
        const double c2 = cos(0.5 * theta);
        const double s2 = sin(0.5 * theta);
        const double c3 = cos(0.5 * psi);
        const double s3 = sin(0.5 * psi);
        const double q0 = c1 * c2 * c3 - s1 * s2 * s3;
        const double q1 = c1 * s2 * s3 + s1 * c2 * c3;
        const double q2 = c1 * c2 * s3 + s1 * s2 * c3;
        const double q3 = c1 * s2 * c3 - s1 * c2 * s3;
        return Quaternion(q0, q1, q2, q3);
    }